

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O1

void ay8910_write_reg(ay8910_context *psg,UINT8 r,UINT8 v)

{
  byte bVar1;
  byte bVar2;
  undefined3 in_register_00000031;
  uint uVar3;
  
  uVar3 = CONCAT31(in_register_00000031,r);
  psg->regs[uVar3] = v;
  if (uVar3 == 0xd) {
    bVar2 = psg->regs[0xd];
    if ((bVar2 & 4) == 0) {
      bVar1 = 0;
    }
    else {
      bVar1 = psg->env_step_mask;
    }
    psg->attack = bVar1;
    if ((bVar2 & 8) == 0) {
      psg->hold = '\x01';
      bVar2 = bVar1;
    }
    else {
      psg->hold = bVar2 & 1;
      bVar2 = bVar2 & 2;
    }
    psg->alternate = bVar2;
    psg->env_step = psg->env_step_mask;
    psg->holding = '\0';
    psg->env_volume = (uint)bVar1 ^ (int)(char)psg->env_step_mask;
  }
  else if (uVar3 == 7) {
    if (psg->last_enable == 0xff) {
      psg->last_enable = ~psg->regs[7];
    }
    if ((~v & 0x3f) != 0) {
      psg->IsDisabled = '\0';
    }
    psg->last_enable = psg->regs[7] & 0xc0;
    return;
  }
  return;
}

Assistant:

void ay8910_write_reg(ay8910_context *psg, UINT8 r, UINT8 v)
{
	//if (r >= 11 && r <= 13 ) printf("%d %x %02x\n", PSG->index, r, v);
	psg->regs[r] = v;

	switch( r )
	{
		case AY_AFINE:
		case AY_ACOARSE:
		case AY_BFINE:
		case AY_BCOARSE:
		case AY_CFINE:
		case AY_CCOARSE:
		case AY_NOISEPER:
		case AY_AVOL:
		case AY_BVOL:
		case AY_CVOL:
		case AY_EFINE:
		case AY_ECOARSE:
			/* No action required */
			break;
		case AY_ENABLE:
			if (psg->last_enable == 0xFF)
				psg->last_enable = ~psg->regs[AY_ENABLE];

			if ((psg->last_enable & 0x40) != (psg->regs[AY_ENABLE] & 0x40))
			{
				/* write out 0xff if port set to input */
				//if (psg->port_a_write_cb != NULL)
				//	psg->port_a_write_cb(psg, 0, (psg->regs[AY_ENABLE] & 0x40) ? psg->regs[AY_PORTA] : 0xff);
			}

			if ((psg->last_enable & 0x80) != (psg->regs[AY_ENABLE] & 0x80))
			{
				/* write out 0xff if port set to input */
				//if (psg->port_b_write_cb != NULL)
				//	psg->port_b_write_cb(psg, 0, (psg->regs[AY_ENABLE] & 0x80) ? psg->regs[AY_PORTB] : 0xff);
			}
			if (~v & 0x3F)	// one of the channels gets enabled -> enable emulation
				psg->IsDisabled = 0x00;

			psg->last_enable = psg->regs[AY_ENABLE] & 0xC0;
			break;
		case AY_ESHAPE:
			//if ( (v & 0x0f) > 0)
			//	osd_printf_verbose("EShape\n");
			psg->attack = (psg->regs[AY_ESHAPE] & 0x04) ? psg->env_step_mask : 0x00;
			if ((psg->regs[AY_ESHAPE] & 0x08) == 0)
			{
				/* if Continue = 0, map the shape to the equivalent one which has Continue = 1 */
				psg->hold = 1;
				psg->alternate = psg->attack;
			}
			else
			{
				psg->hold = psg->regs[AY_ESHAPE] & 0x01;
				psg->alternate = psg->regs[AY_ESHAPE] & 0x02;
			}
			psg->env_step = psg->env_step_mask;
			psg->holding = 0;
			psg->env_volume = (psg->env_step ^ psg->attack);
			break;
		case AY_PORTA:
			if (psg->regs[AY_ENABLE] & 0x40)
			{
				//if (psg->port_a_write_cb != NULL)
				//	psg->port_a_write_cb(psg, 0, psg->regs[AY_PORTA]);
				//else
				//	logerror("warning: unmapped write %02x to %s Port A\n", v, "AY8910");
			}
			else
			{
#if LOG_IGNORED_WRITES
				logerror("warning: write %02x to %s Port A set as input - ignored\n", v, "AY8910");
#endif
			}
			break;
		case AY_PORTB:
			if (psg->regs[AY_ENABLE] & 0x80)
			{
				//if (psg->port_b_write_cb != NULL)
				//	psg->port_b_write_cb(psg, 0, psg->regs[AY_PORTB]);
				//else
				//	logerror("warning: unmapped write %02x to %s Port B\n", v, "AY8910");
			}
			else
			{
#if LOG_IGNORED_WRITES
				logerror("warning: write %02x to %s Port B set as input - ignored\n", v, "AY8910");
#endif
			}
			break;
	}
}